

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv__platform_loop_init(uv_loop_t *loop)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -1;
    if ((*piVar3 == 0x26) || (*piVar3 == 0x16)) {
      iVar2 = epoll_create(0x100);
      if (iVar2 != -1) {
        uv__cloexec_ioctl(iVar2,1);
        iVar1 = iVar2;
      }
    }
  }
  loop->backend_fd = iVar1;
  loop->inotify_fd = -1;
  loop->inotify_watchers = (void *)0x0;
  iVar2 = 0;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar2 = -*piVar3;
  }
  return iVar2;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  int fd;

  /* It was reported that EPOLL_CLOEXEC is not defined on Android API < 21,
   * a.k.a. Lollipop. Since EPOLL_CLOEXEC is an alias for O_CLOEXEC on all
   * architectures, we just use that instead.
   */
#if defined(__ANDROID_API__) && __ANDROID_API__ < 21
  fd = -1;
  errno = ENOSYS;
#else
  fd = epoll_create1(O_CLOEXEC);
#endif

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the O_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return UV__ERR(errno);

  return 0;
}